

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

_Bool duckdb_je_arena_ralloc_no_move
                (tsdn_t *tsdn,void *ptr,size_t oldsize,size_t size,size_t extra,_Bool zero,
                size_t *newsize)

{
  rtree_ctx_cache_elm_t *prVar1;
  char cVar2;
  int iVar3;
  void *pvVar4;
  arena_t *arena;
  rtree_leaf_elm_t *prVar5;
  long lVar6;
  _Bool _Var7;
  szind_t sVar8;
  uint uVar9;
  void *pvVar10;
  size_t usize_min;
  rtree_ctx_t *ctx;
  ulong uVar11;
  size_t usize_max;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  rtree_leaf_elm_t *prVar14;
  edata_t *edata;
  ulong uVar15;
  bool bVar16;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar10 = (void *)((ulong)ptr & 0xffffffffc0000000);
  uVar15 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  prVar14 = (rtree_leaf_elm_t *)((long)&ctx->cache[0].leafkey + uVar15);
  pvVar4 = *(void **)((long)&ctx->cache[0].leafkey + uVar15);
  if (pvVar4 == pvVar10) {
    prVar14 = (rtree_leaf_elm_t *)
              ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + (long)prVar14[1].le_bits.repr);
  }
  else if ((void *)ctx->l2_cache[0].leafkey == pvVar10) {
    prVar5 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)pvVar4;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar14[1].le_bits.repr;
    (prVar14->le_bits).repr = pvVar10;
    prVar14[1].le_bits.repr = prVar5;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar5->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    prVar12 = ctx->l2_cache + 1;
    if ((void *)ctx->l2_cache[1].leafkey == pvVar10) {
      uVar11 = 0;
      bVar16 = false;
    }
    else {
      uVar15 = 1;
      prVar13 = prVar12;
      do {
        uVar11 = uVar15;
        bVar16 = 6 < uVar11;
        if (uVar11 == 7) goto LAB_001f7557;
        prVar12 = prVar13 + 1;
        prVar1 = prVar13 + 1;
        uVar15 = uVar11 + 1;
        prVar13 = prVar12;
      } while ((void *)prVar1->leafkey != pvVar10);
      bVar16 = 6 < uVar11;
    }
    prVar5 = prVar12->leaf;
    prVar12->leafkey = ctx->l2_cache[uVar11].leafkey;
    prVar12->leaf = ctx->l2_cache[uVar11].leaf;
    ctx->l2_cache[uVar11].leafkey = (uintptr_t)pvVar4;
    ctx->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)prVar14[1].le_bits.repr;
    (prVar14->le_bits).repr = pvVar10;
    prVar14[1].le_bits.repr = prVar5;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_001f7557:
    if (bVar16) {
      prVar14 = duckdb_je_rtree_leaf_elm_lookup_hard
                          (tsdn,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,false);
    }
  }
  edata = (edata_t *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  _Var7 = true;
  if (0x7000000000000000 < size) goto LAB_001f732b;
  if (size < 0x1001) {
    usize_min = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
  }
  else {
    uVar15 = size * 2 - 1;
    lVar6 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    uVar15 = ~(-1L << ((char)lVar6 - 3U & 0x3f));
    if ((uint)lVar6 < 7) {
      uVar15 = 0xf;
    }
    usize_min = ~uVar15 & uVar15 + size;
  }
  uVar15 = extra + size;
  if (uVar15 < 0x1001) {
    usize_max = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar15 + 7 >> 3]];
  }
  else if (uVar15 < 0x7000000000000001) {
    uVar11 = uVar15 * 2 - 1;
    lVar6 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    uVar11 = ~(-1L << ((char)lVar6 - 3U & 0x3f));
    if ((uint)lVar6 < 7) {
      uVar11 = 0xf;
    }
    usize_max = ~uVar11 & uVar15 + uVar11;
  }
  else {
    usize_max = 0;
  }
  if ((0x3800 < oldsize) || (0x3800 < usize_min)) {
    if ((0x3fff < oldsize) && (0x3fff < usize_max)) {
      _Var7 = duckdb_je_large_ralloc_no_move(tsdn,edata,usize_min,usize_max,zero);
    }
    goto LAB_001f732b;
  }
  if (usize_max < 0x3801) {
    if (usize_max < 0x1001) {
      sVar8 = (szind_t)duckdb_je_sz_size2index_tab[usize_max + 7 >> 3];
    }
    else {
      sVar8 = sz_size2index_compute(usize_max);
    }
    if (oldsize < 0x1001) {
      uVar9 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar9 = sz_size2index_compute(oldsize);
    }
    if (sVar8 != uVar9) goto LAB_001f72eb;
  }
  else {
LAB_001f72eb:
    _Var7 = true;
    if ((oldsize < size) || (usize_max < oldsize)) goto LAB_001f732b;
  }
  arena = (arena_t *)duckdb_je_arenas[(uint)edata->e_bits & 0xfff].repr;
  if (tsdn != (tsdn_t *)0x0) {
    cVar2 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar3 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar3 + -1;
    if (iVar3 < 1) {
      if (cVar2 < '\x01') {
        uVar15 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar15;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar15 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,arena,false,false);
        _Var7 = false;
        goto LAB_001f732b;
      }
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick = 0;
    }
  }
  _Var7 = false;
LAB_001f732b:
  *newsize = *(size_t *)
              ((long)duckdb_je_sz_index2size_tab + (ulong)((uint)edata->e_bits >> 0x11 & 0x7f8));
  return _Var7;
}

Assistant:

bool
arena_ralloc_no_move(tsdn_t *tsdn, void *ptr, size_t oldsize, size_t size,
    size_t extra, bool zero, size_t *newsize) {
	bool ret;
	/* Calls with non-zero extra had to clamp extra. */
	assert(extra == 0 || size + extra <= SC_LARGE_MAXCLASS);

	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto done;
	}

	size_t usize_min = sz_s2u(size);
	size_t usize_max = sz_s2u(size + extra);
	if (likely(oldsize <= SC_SMALL_MAXCLASS && usize_min
	    <= SC_SMALL_MAXCLASS)) {
		/*
		 * Avoid moving the allocation if the size class can be left the
		 * same.
		 */
		assert(bin_infos[sz_size2index(oldsize)].reg_size ==
		    oldsize);
		if ((usize_max > SC_SMALL_MAXCLASS
		    || sz_size2index(usize_max) != sz_size2index(oldsize))
		    && (size > oldsize || usize_max < oldsize)) {
			ret = true;
			goto done;
		}

		arena_t *arena = arena_get_from_edata(edata);
		arena_decay_tick(tsdn, arena);
		ret = false;
	} else if (oldsize >= SC_LARGE_MINCLASS
	    && usize_max >= SC_LARGE_MINCLASS) {
		ret = large_ralloc_no_move(tsdn, edata, usize_min, usize_max,
		    zero);
	} else {
		ret = true;
	}
done:
	assert(edata == emap_edata_lookup(tsdn, &arena_emap_global, ptr));
	*newsize = edata_usize_get(edata);

	return ret;
}